

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawSchema * __thiscall capnp::SchemaLoader::Impl::load(Impl *this,Reader *reader,bool isPlaceholder)

{
  Impl *schema_00;
  bool bVar1;
  Which kind;
  word *data;
  uint64_t uVar2;
  ChunkHeader *pCVar3;
  size_t sVar4;
  ArrayPtr<const_unsigned_char> *pAVar5;
  Dependency *pDVar6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar7;
  Entry *local_338;
  InitializerImpl *local_330;
  byte local_311;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> local_2a8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_298;
  undefined1 local_280 [8];
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> deps;
  CompatibilityChecker checker;
  Reader existing;
  RawSchema **match;
  undefined1 local_1b0 [16];
  RawSchema **_match1251;
  bool shouldClearInitializer;
  Impl *pIStack_198;
  bool shouldReplace;
  RawSchema *schema;
  ArrayPtr<const_char> local_188;
  ArrayPtr<const_char> local_178;
  undefined1 local_158 [8];
  Reader validatedReader;
  Validator validator;
  undefined1 local_38 [8];
  ArrayPtr<capnp::word> validated;
  bool isPlaceholder_local;
  Reader *reader_local;
  Impl *this_local;
  
  validated.size_._7_1_ = isPlaceholder;
  _local_38 = makeUncheckedNodeEnforcingSizeRequirements(this,(Reader)reader->_reader);
  Validator::Validator((Validator *)&validatedReader._reader.nestingLimit,this);
  data = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)local_38);
  readMessageUnchecked<capnp::schema::Node>((Reader *)local_158,data);
  bVar1 = Validator::validate((Validator *)&validatedReader._reader.nestingLimit,(Reader *)local_158
                             );
  if (bVar1) {
    capnp::schema::Node::Reader::getId((Reader *)local_158);
    kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::find<unsigned_long>
              ((HashMap<unsigned_long,_capnp::_::RawSchema_*> *)local_1b0,
               (unsigned_long *)&this->schemas);
    local_1b0._8_8_ =
         kj::_::readMaybe<capnp::_::RawSchema*>((Maybe<capnp::_::RawSchema_*&> *)local_1b0);
    if ((RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)local_1b0._8_8_ ==
        (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)0x0) {
      pIStack_198 = (Impl *)kj::Arena::allocate<capnp::_::RawSchema>(&this->arena);
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes.buckets.size_ = 0;
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes.buckets.disposer = (ArrayDisposer *)0x0;
      ((RawBrandedSchema *)
      &(pIStack_198->dedupTable).
       super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
       indexes.erasedCount)->generic = (RawSchema *)0x0;
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes.buckets.ptr = (HashBucket *)0x0;
      (pIStack_198->schemas).table.rows.builder.ptr = (Entry *)0x0;
      uVar2 = capnp::schema::Node::Reader::getId((Reader *)local_158);
      (pIStack_198->arena).nextChunkSize = uVar2;
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
      builder.disposer = (ArrayDisposer *)0x0;
      ((RawBrandedSchema *)
      &(pIStack_198->dedupTable).
       super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
       indexes.erasedCount)->generic = (RawSchema *)pIStack_198;
      if ((validated.size_._7_1_ & 1) == 0) {
        local_330 = (InitializerImpl *)0x0;
      }
      else {
        local_330 = &this->initializer;
      }
      *(InitializerImpl **)
       &(pIStack_198->dedupTable).
        super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
        indexes = local_330;
      if ((validated.size_._7_1_ & 1) == 0) {
        local_338 = (Entry *)0x0;
      }
      else {
        local_338 = (Entry *)&this->brandedInitializer;
      }
      (pIStack_198->schemas).table.rows.builder.ptr = local_338;
      _match1251._7_1_ = 1;
      _match1251._6_1_ = 0;
      uVar2 = capnp::schema::Node::Reader::getId((Reader *)local_158);
      kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::insert
                (&this->schemas,uVar2,(RawSchema *)pIStack_198);
    }
    else {
      pIStack_198 = (Impl *)((RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>
                              *)local_1b0._8_8_)->key;
      local_311 = 0;
      if (*(Initializer **)
           &(pIStack_198->dedupTable).
            super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
            indexes != (Initializer *)0x0) {
        local_311 = validated.size_._7_1_ ^ 0xff;
      }
      _match1251._6_1_ = local_311 & 1;
      readMessageUnchecked<capnp::schema::Node>
                ((Reader *)&checker.compatibility,(word *)(pIStack_198->arena).chunkList);
      CompatibilityChecker::CompatibilityChecker((CompatibilityChecker *)&deps.size_,this);
      _match1251._7_1_ =
           CompatibilityChecker::shouldReplace
                     ((CompatibilityChecker *)&deps.size_,(Reader *)&checker.compatibility,
                      (Reader *)local_158,
                      *(Initializer **)
                       &(pIStack_198->dedupTable).
                        super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                        .indexes != (Initializer *)0x0);
    }
    if ((_match1251._7_1_ & 1) != 0) {
      pCVar3 = (ChunkHeader *)kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)local_38);
      (pIStack_198->arena).chunkList = pCVar3;
      sVar4 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)local_38);
      *(uint32_t *)&(pIStack_198->arena).objectList = (uint32_t)sVar4;
      pCVar3 = (ChunkHeader *)
               Validator::makeDependencyArray
                         ((Validator *)&validatedReader._reader.nestingLimit,
                          (uint32_t *)
                          &(pIStack_198->dedupTable).
                           super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                           .rows.builder.pos);
      (pIStack_198->arena).currentChunk = pCVar3;
      pAVar5 = (ArrayPtr<const_unsigned_char> *)
               Validator::makeMemberInfoArray
                         ((Validator *)&validatedReader._reader.nestingLimit,
                          (uint32_t *)
                          ((long)&(pIStack_198->dedupTable).
                                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                                  .rows.builder.pos + 4));
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
      builder.ptr = pAVar5;
      pAVar5 = (ArrayPtr<const_unsigned_char> *)
               Validator::makeMembersByDiscriminantArray
                         ((Validator *)&validatedReader._reader.nestingLimit);
      schema_00 = pIStack_198;
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
      builder.endPtr = pAVar5;
      kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::ArrayPtr(&local_2a8);
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                (&local_298,&local_2a8);
      AVar7 = makeBrandedDependencies(this,(RawSchema *)schema_00,&local_298);
      deps.ptr = (Dependency *)AVar7.size_;
      local_280 = (undefined1  [8])AVar7.ptr;
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_298);
      pDVar6 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::begin
                         ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_280);
      (pIStack_198->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes.buckets.size_ = (size_t)pDVar6;
      sVar4 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_280);
      *(uint32_t *)
       ((long)&(pIStack_198->dedupTable).
               super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
               .indexes.buckets.disposer + 4) = (uint32_t)sVar4;
    }
    if ((_match1251._6_1_ & 1) != 0) {
      *(Initializer **)
       &(pIStack_198->dedupTable).
        super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
        indexes = (Initializer *)0x0;
      (pIStack_198->schemas).table.rows.builder.ptr = (Entry *)0x0;
    }
    this_local = pIStack_198;
  }
  else {
    uVar2 = capnp::schema::Node::Reader::getId((Reader *)local_158);
    local_188 = (ArrayPtr<const_char>)
                capnp::schema::Node::Reader::getDisplayName((Reader *)local_158);
    local_178 = local_188;
    kind = capnp::schema::Node::Reader::which((Reader *)local_158);
    this_local = (Impl *)loadEmpty(this,uVar2,(StringPtr)local_178,kind,false);
  }
  schema._4_4_ = 1;
  Validator::~Validator((Validator *)&validatedReader._reader.nestingLimit);
  return (RawSchema *)this_local;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::load(const schema::Node::Reader& reader, bool isPlaceholder) {
  // Make a copy of the node which can be used unchecked.
  kj::ArrayPtr<word> validated = makeUncheckedNodeEnforcingSizeRequirements(reader);

  // Validate the copy.
  Validator validator(*this);
  auto validatedReader = readMessageUnchecked<schema::Node>(validated.begin());

  if (!validator.validate(validatedReader)) {
    // Not valid.  Construct an empty schema of the same type and return that.
    return loadEmpty(validatedReader.getId(),
                     validatedReader.getDisplayName(),
                     validatedReader.which(),
                     false);
  }

  // Check if we already have a schema for this ID.
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_SOME(match, schemas.find(validatedReader.getId())) {
    // Yes, check if it is compatible and figure out which schema is newer.

    schema = match;

    // If the existing schema is a placeholder, but we're upgrading it to a non-placeholder, we
    // need to clear the initializer later.
    shouldClearInitializer = schema->lazyInitializer != nullptr && !isPlaceholder;

    auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
    CompatibilityChecker checker(*this);

    // Prefer to replace the existing schema if the existing schema is a placeholder.  Otherwise,
    // prefer to keep the existing schema.
    shouldReplace = checker.shouldReplace(
        existing, validatedReader, schema->lazyInitializer != nullptr);
  } else {
    // Nope, allocate a new RawSchema.
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->id = validatedReader.getId();
    schema->canCastTo = nullptr;
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = isPlaceholder ? &initializer : nullptr;
    schema->defaultBrand.lazyInitializer = isPlaceholder ? &brandedInitializer : nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;
    schemas.insert(validatedReader.getId(), schema);
  }